

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaAllocation_T::DedicatedAllocUnmap(VmaAllocation_T *this,VmaAllocator hAllocator)

{
  uint8_t uVar1;
  
  if (((this->m_MapCount != '\0') &&
      (uVar1 = this->m_MapCount + 0xff, this->m_MapCount = uVar1, uVar1 == '\0')) &&
     ((this->m_Flags & 1) == 0)) {
    (this->field_0).m_DedicatedAllocation.m_pMappedData = (void *)0x0;
    (*(hAllocator->m_VulkanFunctions).vkUnmapMemory)
              (hAllocator->m_hDevice,(this->field_0).m_DedicatedAllocation.m_hMemory);
    return;
  }
  return;
}

Assistant:

void VmaAllocation_T::DedicatedAllocUnmap(VmaAllocator hAllocator)
{
    VMA_ASSERT(GetType() == ALLOCATION_TYPE_DEDICATED);

    if (m_MapCount > 0)
    {
        --m_MapCount;
        if (m_MapCount == 0 && !IsPersistentMap())
        {
            m_DedicatedAllocation.m_pMappedData = VMA_NULL;
            (*hAllocator->GetVulkanFunctions().vkUnmapMemory)(
                hAllocator->m_hDevice,
                m_DedicatedAllocation.m_hMemory);
        }
    }
    else
    {
        VMA_ASSERT(0 && "Unmapping dedicated allocation not previously mapped.");
    }
}